

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O2

time_t ctemplate::TemplateNamelist::GetLastmodTime(void)

{
  int iVar1;
  NameListType *pNVar2;
  __node_base *p_Var3;
  long lVar4;
  string path;
  stat statbuf;
  
  pNVar2 = GetList_abi_cxx11_();
  p_Var3 = &(pNVar2->_M_h)._M_before_begin;
  lVar4 = -1;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    Template::FindTemplateFilename(&path,(string *)(p_Var3 + 1));
    if (path._M_string_length != 0) {
      iVar1 = stat(path._M_dataplus._M_p,(stat *)&statbuf);
      if ((iVar1 == 0) && (lVar4 <= statbuf.st_mtim.tv_sec)) {
        lVar4 = statbuf.st_mtim.tv_sec;
      }
    }
    std::__cxx11::string::~string((string *)&path);
  }
  return lVar4;
}

Assistant:

time_t TemplateNamelist::GetLastmodTime() {
  time_t retval = -1;

  const NameListType& the_list = TemplateNamelist::GetList();
  for (NameListType::const_iterator iter = the_list.begin();
       iter != the_list.end();
       ++iter) {
    // Only prepend root_dir if *iter isn't an absolute path:
    const string path = Template::FindTemplateFilename(*iter);
    struct stat statbuf;
    if (path.empty() || stat(path.c_str(), &statbuf) != 0)
      continue;  // ignore files we can't find
    retval = max(retval, statbuf.st_mtime);
  }
  return retval;
}